

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdStoreLane<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  uint *puVar4;
  Memory *pMVar5;
  long lVar6;
  u64 uVar7;
  string local_a0;
  Ptr local_80;
  Enum local_64;
  u64 local_60;
  u64 offset;
  undefined1 auStack_50 [4];
  T val;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  result.v._8_8_ = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr
            ((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,(Ref)result.v._8_8_);
  _auStack_50 = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  puVar4 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                     ((Simd<unsigned_int,_(unsigned_char)__x04_> *)auStack_50,
                      instr.field_2.imm_u32x2_u8.idx);
  offset._4_4_ = *puVar4;
  local_60 = PopPtr(this,(Ptr *)local_38);
  pMVar5 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  local_64 = (Enum)Memory::Store<unsigned_int>
                             (pMVar5,local_60,(ulong)instr.field_2.imm_u32x2.snd,offset._4_4_);
  bVar2 = Failed((Result)local_64);
  if (bVar2) {
    pSVar1 = this->store_;
    lVar6 = local_60 + instr.field_2.imm_u32x2.snd;
    pMVar5 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
    uVar7 = Memory::ByteSize(pMVar5);
    StringPrintf_abi_cxx11_
              (&local_a0,"out of bounds memory access: access at %lu+%zd >= max value %lu",lVar6,4,
               uVar7);
    Trap::New(&local_80,pSVar1,&local_a0,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_80);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdStoreLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2_u8.fst]};
  auto result = Pop<S>();
  T val = result[instr.imm_u32x2_u8.idx];
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->Store(offset, instr.imm_u32x2_u8.snd, val)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %" PRIu64,
                       offset + instr.imm_u32x2_u8.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}